

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

int minTemp1_fast_moreThen5(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  bVar1 = (byte)(iVar + -6);
  uVar4 = 1 << (bVar1 & 0x1f);
  iVar3 = 1;
  iVar5 = (-2 << (bVar1 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar1 & 0x1f)) + nWords;
  if (iVar5 < 0) {
    iVar5 = 0;
  }
  else {
    uVar2 = 1;
    if (1 < (int)uVar4) {
      uVar2 = (ulong)uVar4;
    }
    do {
      if (iVar + -6 != 0x1f) {
        lVar6 = 0;
        do {
          iVar3 = -(uint)(pInOut[iVar5 + lVar6] < pInOut[(iVar5 + lVar6) - (long)(int)uVar4]);
          if (pInOut[(iVar5 + lVar6) - (long)(int)uVar4] < pInOut[iVar5 + lVar6]) {
            iVar3 = 1;
          }
          if (iVar3 != 0) {
            iVar5 = uVar4 + iVar5 + 1;
            if (iVar3 == -1) goto LAB_0054145a;
            iVar3 = 2;
            goto LAB_00541474;
          }
          lVar6 = lVar6 + -1;
        } while (-lVar6 != uVar2);
      }
      iVar5 = iVar5 + (-4 << (bVar1 & 0x1f));
    } while (-1 < iVar5);
    iVar5 = 0;
LAB_0054145a:
    iVar3 = 1;
  }
LAB_00541474:
  *pDifStart = iVar5;
  return iVar3;
}

Assistant:

int minTemp1_fast_moreThen5(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp1_fast_moreThen5\n");

    for(i=nWords - wordBlock - 1; i>=0; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j],pInOut[i-j-wordBlock]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+wordBlock+1;
                return 1;
            }
            else
            {
                *pDifStart = i+wordBlock+1;
                return 2;
            }
        }
    *pDifStart=0;
//    printf("out minTemp1_fast_moreThen5\n");

    return 1;
}